

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_util.c
# Opt level: O1

int ImgIoUtilWriteFile(char *file_name,uint8_t *data,size_t data_size)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  uint uVar3;
  bool bVar4;
  
  if (file_name == (char *)0x0) {
    bVar4 = true;
  }
  else {
    iVar1 = strcmp(file_name,"-");
    bVar4 = iVar1 == 0;
  }
  if (data == (uint8_t *)0x0) {
    uVar3 = 0;
  }
  else {
    __s = _stdout;
    if (!bVar4) {
      __s = fopen(file_name,"wb");
    }
    if (__s == (FILE *)0x0) {
      uVar3 = 0;
      fprintf(stderr,"Error! Cannot open output file \'%s\'\n",file_name);
    }
    else {
      sVar2 = fwrite(data,data_size,1,__s);
      uVar3 = (uint)(sVar2 == 1);
      if (__s != _stdout) {
        fclose(__s);
      }
    }
  }
  return uVar3;
}

Assistant:

int ImgIoUtilWriteFile(const char* const file_name,
                       const uint8_t* data, size_t data_size) {
  int ok;
  FILE* out;
  const int to_stdout = (file_name == NULL) || !WSTRCMP(file_name, "-");

  if (data == NULL) {
    return 0;
  }
  out = to_stdout ? ImgIoUtilSetBinaryMode(stdout) : WFOPEN(file_name, "wb");
  if (out == NULL) {
    WFPRINTF(stderr, "Error! Cannot open output file '%s'\n",
             (const W_CHAR*)file_name);
    return 0;
  }
  ok = (fwrite(data, data_size, 1, out) == 1);
  if (out != stdout) fclose(out);
  return ok;
}